

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_detections.c
# Opt level: O0

void kws_detections_add(kws_detections_t *detections,char *keyphrase,int sf,int ef,int prob,int ascr
                       )

{
  char *pcVar1;
  int iVar2;
  undefined8 *ptr;
  glist_t pgVar3;
  kws_detection_t *det;
  kws_detection_t *detection;
  gnode_t *gn;
  int ascr_local;
  int prob_local;
  int ef_local;
  int sf_local;
  char *keyphrase_local;
  kws_detections_t *detections_local;
  
  detection = (kws_detection_t *)detections->detect_list;
  while( true ) {
    if (detection == (kws_detection_t *)0x0) {
      ptr = (undefined8 *)
            __ckd_calloc__(1,0x18,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_detections.c"
                           ,0x4a);
      *(int *)(ptr + 1) = sf;
      *(int *)((long)ptr + 0xc) = ef;
      *ptr = keyphrase;
      *(int *)(ptr + 2) = prob;
      *(int *)((long)ptr + 0x14) = ascr;
      pgVar3 = glist_add_ptr(detections->detect_list,ptr);
      detections->detect_list = pgVar3;
      return;
    }
    pcVar1 = detection->keyphrase;
    iVar2 = strcmp(keyphrase,*(char **)pcVar1);
    if (((iVar2 == 0) && (*(int *)(pcVar1 + 8) < ef)) && (sf < *(int *)(pcVar1 + 0xc))) break;
    detection = *(kws_detection_t **)&detection->sf;
  }
  if (prob <= *(int *)(pcVar1 + 0x10)) {
    return;
  }
  *(int *)(pcVar1 + 8) = sf;
  *(int *)(pcVar1 + 0xc) = ef;
  *(int *)(pcVar1 + 0x10) = prob;
  *(int *)(pcVar1 + 0x14) = ascr;
  return;
}

Assistant:

void
kws_detections_add(kws_detections_t *detections, const char* keyphrase, int sf, int ef, int prob, int ascr)
{
    gnode_t *gn;
    kws_detection_t* detection;
    for (gn = detections->detect_list; gn; gn = gnode_next(gn)) {
        kws_detection_t *det = (kws_detection_t *)gnode_ptr(gn);
        if (strcmp(keyphrase, det->keyphrase) == 0 && det->sf < ef && det->ef > sf) {
            if (det->prob < prob) {
                det->sf = sf;
                det->ef = ef;
                det->prob = prob;
                det->ascr = ascr;
            }
            return;
        }
    }

    /* Nothing found */
    detection = (kws_detection_t *)ckd_calloc(1, sizeof(*detection));
    detection->sf = sf;
    detection->ef = ef;
    detection->keyphrase = keyphrase;
    detection->prob = prob;
    detection->ascr = ascr;
    detections->detect_list = glist_add_ptr(detections->detect_list, detection);
}